

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O1

size_t OPENSSL_strlcpy(char *dst,char *src,size_t dst_size)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  
  if (dst_size < 2) {
    lVar1 = 0;
  }
  else {
    lVar3 = dst_size - 1;
    lVar1 = 0;
    do {
      if (src[lVar1] == '\0') {
        src = src + lVar1;
        dst = dst + lVar1;
        dst_size = 1;
        goto LAB_00168d73;
      }
      dst[lVar1] = src[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar3 != lVar1);
    src = src + lVar1;
    dst = dst + lVar1;
    dst_size = 1;
    lVar1 = lVar3;
  }
LAB_00168d73:
  if (dst_size != 0) {
    *dst = '\0';
  }
  sVar2 = strlen(src);
  return sVar2 + lVar1;
}

Assistant:

size_t OPENSSL_strlcpy(char *dst, const char *src, size_t dst_size) {
  size_t l = 0;

  for (; dst_size > 1 && *src; dst_size--) {
    *dst++ = *src++;
    l++;
  }

  if (dst_size) {
    *dst = 0;
  }

  return l + strlen(src);
}